

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestSkip::Run(TestSkip *this)

{
  Results rs;
  TestSkipInternal myTestA;
  ostringstream oss;
  TestRegistry r;
  string sStack_1658;
  RunParams local_1638;
  Test local_1620;
  ostringstream local_15e0 [376];
  TestRegistry local_1468;
  
  testinator::TestRegistry::TestRegistry(&local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1620
            );
  std::__cxx11::string::string((string *)&sStack_1658,"A",(allocator *)&local_1638);
  TestSkipInternal::TestSkipInternal((TestSkipInternal *)&local_1620,&local_1468,&sStack_1658);
  std::__cxx11::string::~string((string *)&sStack_1658);
  local_1638.m_flags = 0;
  local_1638._4_4_ = 0;
  local_1638.m_numPropertyChecks = 100;
  local_1638.m_randomSeed = 0;
  testinator::TestRegistry::RunAllTests
            ((Results *)&sStack_1658,&local_1468,&local_1638,(Outputter *)local_1620._vptr_Test);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&sStack_1658);
  testinator::Test::~Test(&local_1620);
  if ((Outputter *)local_1620._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1620._vptr_Test)[8])(local_1620._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry(&local_1468);
  return local_1620.m_skipped;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestSkipInternal myTestA(r, "A");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

    return myTestA.skipped();
  }